

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int read_exttime(char *p,rar *rar,char *endp)

{
  ushort uVar1;
  int iVar2;
  ushort uVar3;
  uint uVar4;
  tm *__tp;
  time_t *ptVar5;
  long lVar6;
  long *plVar7;
  uint uVar8;
  uchar *p_2;
  int iVar9;
  int *piVar10;
  bool bVar11;
  time_t t;
  tm tmbuf;
  time_t local_c0;
  int *local_b8;
  long *local_b0;
  time_t *local_a8;
  long *local_a0;
  time_t *local_98;
  long *local_90;
  time_t *local_88;
  long *local_80;
  time_t *local_78;
  rar *local_70;
  tm local_68;
  
  piVar10 = (int *)(p + 2);
  iVar9 = -1;
  if (piVar10 <= endp) {
    uVar1 = *(ushort *)p;
    local_98 = &rar->atime;
    local_a0 = &rar->ansec;
    local_88 = &rar->ctime;
    local_90 = &rar->cnsec;
    local_a8 = &rar->arctime;
    local_b0 = &rar->arcnsec;
    local_78 = &rar->mtime;
    local_80 = &rar->mnsec;
    iVar9 = 3;
    local_b8 = (int *)endp;
    local_70 = rar;
    do {
      local_c0 = 0;
      if (iVar9 == 3) {
        local_c0 = rar->mtime;
      }
      uVar3 = uVar1 >> ((char)iVar9 * '\x04' & 0x1fU);
      if ((uVar3 & 8) != 0) {
        if (local_c0 == 0) {
          if (local_b8 < piVar10 + 1) {
            return -1;
          }
          local_c0 = get_time(*piVar10);
          piVar10 = piVar10 + 1;
        }
        uVar4 = uVar3 & 3;
        if (local_b8 < (int *)((ulong)uVar4 + (long)piVar10)) {
          return -1;
        }
        if ((ulong)uVar4 == 0) {
          uVar4 = 0;
        }
        else {
          lVar6 = 0;
          uVar8 = 0;
          do {
            uVar8 = uVar8 >> 8 | (uint)*(byte *)((long)piVar10 + lVar6) << 0x10;
            lVar6 = lVar6 + 1;
          } while (uVar4 != (uint)lVar6);
          piVar10 = (int *)((long)piVar10 + (ulong)(uVar4 - 1) + 1);
          uVar4 = (uint)((ulong)uVar8 * 0x6b5fcb >> 0x2e);
        }
        __tp = localtime_r(&local_c0,&local_68);
        iVar2 = __tp->tm_sec;
        if ((uVar3 & 4) != 0) {
          __tp->tm_sec = iVar2 + 1;
          local_c0 = mktime(__tp);
        }
        ptVar5 = local_78;
        plVar7 = local_80;
        if (((iVar9 != 3) && (ptVar5 = local_88, plVar7 = local_90, iVar9 != 2)) &&
           (ptVar5 = local_98, plVar7 = local_a0, iVar9 != 1)) {
          ptVar5 = local_a8;
          plVar7 = local_b0;
        }
        *ptVar5 = local_c0;
        *plVar7 = (ulong)(iVar2 + uVar4);
        rar = local_70;
      }
      bVar11 = iVar9 != 0;
      iVar9 = iVar9 + -1;
    } while (bVar11);
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

static int
read_exttime(const char *p, struct rar *rar, const char *endp)
{
  unsigned rmode, flags, rem, j, count;
  int ttime, i;
  struct tm *tm;
  time_t t;
  long nsec;
#if defined(HAVE_LOCALTIME_R) || defined(HAVE_LOCALTIME_S)
  struct tm tmbuf;
#endif

  if (p + 2 > endp)
    return (-1);
  flags = archive_le16dec(p);
  p += 2;

  for (i = 3; i >= 0; i--)
  {
    t = 0;
    if (i == 3)
      t = rar->mtime;
    rmode = flags >> i * 4;
    if (rmode & 8)
    {
      if (!t)
      {
        if (p + 4 > endp)
          return (-1);
        ttime = archive_le32dec(p);
        t = get_time(ttime);
        p += 4;
      }
      rem = 0;
      count = rmode & 3;
      if (p + count > endp)
        return (-1);
      for (j = 0; j < count; j++)
      {
        rem = (((unsigned)(unsigned char)*p) << 16) | (rem >> 8);
        p++;
      }
#if defined(HAVE_LOCALTIME_S)
      tm = localtime_s(&tmbuf, &t) ? NULL : &tmbuf;
#elif defined(HAVE_LOCALTIME_R)
      tm = localtime_r(&t, &tmbuf);
#else
      tm = localtime(&t);
#endif
      nsec = tm->tm_sec + rem / NS_UNIT;
      if (rmode & 4)
      {
        tm->tm_sec++;
        t = mktime(tm);
      }
      if (i == 3)
      {
        rar->mtime = t;
        rar->mnsec = nsec;
      }
      else if (i == 2)
      {
        rar->ctime = t;
        rar->cnsec = nsec;
      }
      else if (i == 1)
      {
        rar->atime = t;
        rar->ansec = nsec;
      }
      else
      {
        rar->arctime = t;
        rar->arcnsec = nsec;
      }
    }
  }
  return (0);
}